

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GEOM ref_geom;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  uint uVar6;
  int *piVar7;
  REF_INT *pRVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  REF_INT RVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  FILE *pFVar18;
  REF_CELL ref_cell;
  REF_INT local;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL radius;
  REF_DBL gap;
  REF_DBL tvalue;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_DBL normal [3];
  int local_140;
  int local_13c;
  REF_DICT local_138;
  REF_DBL local_130;
  REF_DBL *local_128;
  REF_NODE local_120;
  FILE *local_118;
  ulong local_110;
  REF_DBL local_108;
  REF_DBL local_100;
  REF_DBL local_f8;
  REF_DBL local_f0;
  REF_DBL local_e8;
  REF_DBL *local_e0;
  ulong local_d8;
  REF_CELL local_d0;
  long local_c8;
  ulong local_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  REF_DBL local_48 [3];
  
  pRVar2 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  uVar4 = ref_dict_create(&local_138);
  if (uVar4 != 0) {
    pcVar11 = "create dict";
    uVar9 = 0xb92;
    goto LAB_00137e20;
  }
  local_120 = pRVar2;
  local_118 = (FILE *)file;
  if (ref_geom->max < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    pRVar8 = ref_geom->descr;
    uVar10 = 0xffffffff;
    lVar16 = 0;
    uVar12 = 0;
    local_d0 = ref_cell;
    do {
      if ((*(int *)((long)pRVar8 + lVar16) == 1) && (*(int *)((long)pRVar8 + lVar16 + 4) == id)) {
        uVar4 = ref_dict_store(local_138,*(REF_INT *)((long)pRVar8 + lVar16 + 0x14),(REF_INT)uVar12)
        ;
        if (uVar4 != 0) {
          pcVar11 = "mark nodes";
          uVar9 = 0xb97;
          goto LAB_00137e20;
        }
        pRVar8 = ref_geom->descr;
        ref_cell = local_d0;
        if (*(int *)((long)pRVar8 + lVar16 + 0xc) != 0) {
          if ((int)uVar10 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb99,"ref_geom_edge_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)(int)uVar10);
            return 1;
          }
          uVar10 = uVar12 & 0xffffffff;
        }
      }
      uVar12 = uVar12 + 1;
      lVar16 = lVar16 + 0x18;
    } while ((long)uVar12 < (long)ref_geom->max);
  }
  local_c0 = uVar10;
  if (0 < ref_cell->max) {
    local_110 = (ulong)((uint)((int)uVar10 != -1) + local_138->n);
    RVar14 = 0;
    uVar10 = 0;
    do {
      RVar5 = ref_cell_nodes(ref_cell,RVar14,(REF_INT *)&local_b8);
      uVar12 = local_110;
      uVar4 = (int)uVar10 + (uint)(local_b0 == id && RVar5 == 0);
      uVar10 = (ulong)uVar4;
      RVar14 = RVar14 + 1;
    } while (RVar14 < ref_cell->max);
    iVar15 = (int)local_110;
    if ((iVar15 != 0) && (uVar4 != 0)) {
      fprintf(local_118,"zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)id,local_110 & 0xffffffff,uVar10,"point","felineseg");
      if (iVar15 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xbb3,"ref_geom_edge_tec_zone","malloc t of REF_DBL negative");
        return 1;
      }
      uVar12 = uVar12 & 0xffffffff;
      local_128 = (REF_DBL *)malloc(uVar12 * 8);
      if (local_128 == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xbb3,"ref_geom_edge_tec_zone","malloc t of REF_DBL NULL");
        return 2;
      }
      local_d8 = uVar12;
      if (0 < ref_cell->max) {
        iVar15 = (int)local_110 + -1;
        RVar14 = 0;
        do {
          RVar5 = ref_cell_nodes(ref_cell,RVar14,(REF_INT *)&local_b8);
          if ((RVar5 == 0) && (local_b0 == id)) {
            uVar4 = ref_dict_location(local_138,local_b8,&local_140);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xbba,"ref_geom_edge_tec_zone",(ulong)uVar4,"localize");
              printf("edg %d %d id %d no edge geom\n",(ulong)local_b8,(ulong)local_b4,
                     (ulong)local_b0);
              uVar6 = ref_node_location(local_120,local_b8);
              if (uVar6 == 0) {
                ref_geom_tattle(ref_geom,local_b8);
                return uVar4;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,3000,"ref_geom_edge_tec_zone",(ulong)uVar6,"loc");
              return uVar6;
            }
            uVar4 = ref_geom_cell_tuv(ref_geom,local_b8,(REF_INT *)&local_b8,1,&local_100,&local_13c
                                     );
            if (uVar4 != 0) {
              pcVar11 = "from";
              uVar9 = 0xbbd;
              goto LAB_00137e20;
            }
            iVar1 = iVar15;
            if (local_13c != -1) {
              iVar1 = local_140;
            }
            local_140 = iVar1;
            local_128[local_140] = local_100;
            uVar4 = ref_dict_location(local_138,local_b4,&local_140);
            if (uVar4 != 0) {
              pcVar11 = "localize";
              uVar9 = 0xbc0;
              goto LAB_00137e20;
            }
            uVar4 = ref_geom_cell_tuv(ref_geom,local_b4,(REF_INT *)&local_b8,1,&local_100,&local_13c
                                     );
            if (uVar4 != 0) {
              pcVar11 = "from";
              uVar9 = 0xbc3;
              goto LAB_00137e20;
            }
            iVar1 = iVar15;
            if (local_13c != -1) {
              iVar1 = local_140;
            }
            local_140 = iVar1;
            local_128[local_140] = local_100;
          }
          RVar14 = RVar14 + 1;
        } while (RVar14 < ref_cell->max);
      }
      if (0 < local_138->n) {
        piVar7 = local_138->key;
        pRVar8 = local_138->value;
        lVar17 = 4;
        lVar16 = 1;
        local_e0 = local_128;
        while( true ) {
          iVar15 = *piVar7;
          lVar13 = (long)iVar15;
          local_130 = 0.0;
          local_108 = 0.0;
          pRVar3 = local_120->real;
          local_f8 = pRVar3[lVar13 * 0xf];
          local_f0 = pRVar3[lVar13 * 0xf + 1];
          local_e8 = pRVar3[lVar13 * 0xf + 2];
          lVar13 = lVar17;
          if (ref_geom->model != (void *)0x0) {
            local_c8 = lVar17;
            uVar4 = ref_egads_edge_curvature(ref_geom,*pRVar8,&local_130,local_48);
            if (uVar4 != 0) {
              pcVar11 = "curve";
              uVar9 = 0xbd0;
              goto LAB_00137e20;
            }
            if (local_130 <= -local_130) {
              local_130 = -local_130;
            }
            uVar4 = ref_egads_eval_at(ref_geom,1,id,local_e0,&local_f8,(REF_DBL *)0x0);
            if (uVar4 != 0) {
              pcVar11 = "eval at";
              uVar9 = 0xbd3;
              goto LAB_00137e20;
            }
            uVar4 = ref_egads_gap(ref_geom,iVar15,&local_108);
            lVar13 = local_c8;
            if (uVar4 != 0) {
              pcVar11 = "gap";
              uVar9 = 0xbd4;
              goto LAB_00137e20;
            }
          }
          pRVar3 = local_e0;
          fprintf(local_118," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_f8,local_f0,
                  local_e8,local_108,*local_e0,0,local_130,0);
          if (local_138->n <= lVar16) break;
          piVar7 = (int *)((long)local_138->key + lVar13);
          local_e0 = pRVar3 + 1;
          lVar17 = lVar13 + 4;
          pRVar8 = (REF_INT *)(lVar13 + (long)local_138->value);
          lVar16 = lVar16 + 1;
        }
      }
      iVar15 = (int)local_c0;
      if (iVar15 != -1) {
        iVar1 = ref_geom->descr[(long)(iVar15 * 6) + 5];
        lVar16 = (long)iVar1;
        local_130 = 0.0;
        local_108 = 0.0;
        pRVar3 = local_120->real;
        local_f8 = pRVar3[lVar16 * 0xf];
        local_f0 = pRVar3[lVar16 * 0xf + 1];
        local_e8 = pRVar3[lVar16 * 0xf + 2];
        pFVar18 = local_118;
        if (ref_geom->model != (void *)0x0) {
          uVar4 = ref_egads_edge_curvature(ref_geom,iVar15,&local_130,local_48);
          pFVar18 = local_118;
          if (uVar4 != 0) {
            pcVar11 = "curve";
            uVar9 = 0xbe2;
            goto LAB_00137e20;
          }
          if (local_130 <= -local_130) {
            local_130 = -local_130;
          }
          uVar4 = ref_egads_eval_at(ref_geom,1,id,local_128 + (local_d8 - 1),&local_f8,
                                    (REF_DBL *)0x0);
          if (uVar4 != 0) {
            pcVar11 = "eval at";
            uVar9 = 0xbe6;
            goto LAB_00137e20;
          }
          uVar4 = ref_egads_gap(ref_geom,iVar1,&local_108);
          if (uVar4 != 0) {
            pcVar11 = "gap";
            uVar9 = 0xbe7;
            goto LAB_00137e20;
          }
        }
        fprintf(pFVar18," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_f8,local_f0,
                local_e8,local_108,local_128[local_d8 - 1],0,local_130,0);
      }
      free(local_128);
      if (0 < ref_cell->max) {
        local_120 = (REF_NODE)CONCAT44(local_120._4_4_,(int)local_110 + -1);
        iVar15 = 0;
        do {
          RVar5 = ref_cell_nodes(ref_cell,iVar15,(REF_INT *)&local_b8);
          if ((RVar5 == 0) && (local_b0 == id)) {
            uVar4 = ref_dict_location(local_138,local_b8,&local_140);
            if (uVar4 != 0) {
              pcVar11 = "localize";
              uVar9 = 0xbf1;
              goto LAB_00137e20;
            }
            uVar4 = ref_geom_cell_tuv(ref_geom,local_b8,(REF_INT *)&local_b8,1,&local_100,&local_13c
                                     );
            if (uVar4 != 0) {
              pcVar11 = "from";
              uVar9 = 0xbf4;
              goto LAB_00137e20;
            }
            if (local_13c == -1) {
              local_140 = (int)local_120;
              uVar10 = local_110 & 0xffffffff;
            }
            else {
              uVar10 = (ulong)(local_140 + 1);
            }
            fprintf(local_118," %d",uVar10);
            uVar4 = ref_dict_location(local_138,local_b4,&local_140);
            if (uVar4 != 0) {
              pcVar11 = "localize";
              uVar9 = 0xbf7;
              goto LAB_00137e20;
            }
            uVar4 = ref_geom_cell_tuv(ref_geom,local_b4,(REF_INT *)&local_b8,1,&local_100,&local_13c
                                     );
            pFVar18 = local_118;
            if (uVar4 != 0) {
              pcVar11 = "from";
              uVar9 = 0xbfa;
              goto LAB_00137e20;
            }
            if (local_13c == -1) {
              local_140 = (int)local_120;
              uVar10 = local_110 & 0xffffffff;
            }
            else {
              uVar10 = (ulong)(local_140 + 1);
            }
            fprintf(local_118," %d",uVar10);
            fputc(10,pFVar18);
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < ref_cell->max);
      }
      uVar4 = ref_dict_free(local_138);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar11 = "free dict";
      uVar9 = 0xc01;
      goto LAB_00137e20;
    }
  }
  uVar4 = ref_dict_free(local_138);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar11 = "free dict";
  uVar9 = 0xbaa;
LAB_00137e20:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
         "ref_geom_edge_tec_zone",(ulong)uVar4,pcVar11);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edge_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"edge%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[item]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[item], 0.0, radius, 0.0);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &(t[nnode - 1]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, t[nnode - 1], 0.0, radius, 0.0);
  }
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}